

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

int If_CutGetCones(If_Man_t *p)

{
  uint uVar1;
  abctime aVar2;
  If_Obj_t *pObj;
  abctime aVar3;
  abctime time;
  uint uVar4;
  int i;
  
  uVar4 = 0;
  aVar2 = Abc_Clock();
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    pObj = (If_Obj_t *)Vec_PtrEntry(p->vObjs,i);
    if ((((undefined1  [112])*pObj & (undefined1  [112])0xf) == (undefined1  [112])0x4) &&
       (pObj->nRefs != 0)) {
      uVar1 = If_CutGetCone_rec(p,pObj,&pObj->CutBest);
      uVar4 = uVar4 + (uVar1 ^ 1);
    }
  }
  Abc_Print(1,"Cound not find boundary for %d nodes.\n",(ulong)uVar4);
  aVar3 = Abc_Clock();
  Abc_PrintTime(0x8919e3,(char *)(aVar3 - aVar2),time);
  return 1;
}

Assistant:

int If_CutGetCones( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i, Counter = 0;
    abctime clk = Abc_Clock();
    If_ManForEachObj( p, pObj, i )
    {
        if ( If_ObjIsAnd(pObj) && pObj->nRefs )
        {
            Counter += !If_CutGetCone_rec( p, pObj, If_ObjCutBest(pObj) );
//            Abc_Print( 1, "%d ", If_CutGetCutMinLevel( p, If_ObjCutBest(pObj) ) );
        }
    }
    Abc_Print( 1, "Cound not find boundary for %d nodes.\n", Counter );
    Abc_PrintTime( 1, "Cones", Abc_Clock() - clk );
    return 1;
}